

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.h
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
          (ArgBuilder *this,_func_void_ConfigData_ptr *unaryFunction)

{
  BoundUnaryFunction<Catch::ConfigData> *this_00;
  BoundArgFunction<Catch::ConfigData> local_20;
  _func_void_ConfigData_ptr *local_18;
  _func_void_ConfigData_ptr *unaryFunction_local;
  ArgBuilder *this_local;
  
  local_18 = unaryFunction;
  unaryFunction_local = (_func_void_ConfigData_ptr *)this;
  this_00 = (BoundUnaryFunction<Catch::ConfigData> *)operator_new(0x10);
  Detail::BoundUnaryFunction<Catch::ConfigData>::BoundUnaryFunction(this_00,local_18);
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction
            (&local_20,(IArgFunction<Catch::ConfigData> *)this_00);
  Detail::BoundArgFunction<Catch::ConfigData>::operator=
            ((BoundArgFunction<Catch::ConfigData> *)this->m_arg,&local_20);
  Detail::BoundArgFunction<Catch::ConfigData>::~BoundArgFunction(&local_20);
  return;
}

Assistant:

void bind( void (* unaryFunction)( C& ) ) {
                m_arg->boundField = new Detail::BoundUnaryFunction<C>( unaryFunction );
            }